

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O2

QVariant * __thiscall
QSettingsPrivate::value
          (QVariant *__return_storage_ptr__,QSettingsPrivate *this,QAnyStringView key,
          QVariant *defaultValue)

{
  PrivateShared *pPVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  QVariant *pQVar4;
  long in_FS_OFFSET;
  optional<QVariant> r;
  QArrayDataPointer<char16_t> local_70;
  undefined1 local_58 [32];
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (((undefined1  [16])key & (undefined1  [16])0x3fffffffffffffff) == (undefined1  [16])0x0) {
    local_58._0_4_ = 2;
    local_58._20_4_ = 0;
    local_58._4_4_ = 0;
    local_58._8_4_ = 0;
    local_58._12_4_ = 0;
    local_58._16_4_ = 0;
    local_58._24_8_ = "default";
    QMessageLogger::warning((QMessageLogger *)local_58,"QSettings::value: Empty key passed");
  }
  else {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._16_4_ = 0xaaaaaaaa;
    local_58._20_4_ = 0xaaaaaaaa;
    local_58._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_4_ = 0xaaaaaaaa;
    local_58._4_4_ = 0xaaaaaaaa;
    local_58._8_4_ = 0xaaaaaaaa;
    local_58._12_4_ = 0xaaaaaaaa;
    actualKey((QString *)&local_70,this,key);
    (*(this->super_QObjectPrivate).super_QObjectData._vptr_QObjectData[6])(local_58,this,&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    if (local_38._0_1_ == true) {
      pQVar4 = std::_Optional_base_impl<QVariant,_std::_Optional_base<QVariant,_false,_false>_>::
               _M_get((_Optional_base_impl<QVariant,_std::_Optional_base<QVariant,_false,_false>_> *
                      )local_58);
      pPVar1 = (pQVar4->d).data.shared;
      uVar2 = *(undefined8 *)((long)&(pQVar4->d).data + 8);
      uVar3 = *(undefined8 *)&(pQVar4->d).field_0x18;
      *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) =
           *(undefined8 *)((long)&(pQVar4->d).data + 0x10);
      *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = uVar3;
      (__return_storage_ptr__->d).data.shared = pPVar1;
      *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = uVar2;
      (pQVar4->d).data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(pQVar4->d).data + 8) = 0;
      *(undefined8 *)((long)&(pQVar4->d).data + 0x10) = 0;
      *(undefined8 *)&(pQVar4->d).field_0x18 = 2;
      std::_Optional_payload_base<QVariant>::_M_reset((_Optional_payload_base<QVariant> *)local_58);
      goto LAB_003db280;
    }
    std::_Optional_payload_base<QVariant>::_M_reset((_Optional_payload_base<QVariant> *)local_58);
    if (defaultValue != (QVariant *)0x0) {
      ::QVariant::QVariant(__return_storage_ptr__,defaultValue);
      goto LAB_003db280;
    }
  }
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
LAB_003db280:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QSettingsPrivate::value(QAnyStringView key, const QVariant *defaultValue) const
{
    if (key.isEmpty()) {
        qWarning("QSettings::value: Empty key passed");
        return QVariant();
    }
    if (std::optional r = get(actualKey(key)))
        return std::move(*r);
    if (defaultValue)
        return *defaultValue;
    return QVariant();
}